

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O2

void __thiscall
duckdb::CSVSniffer::SniffTypes
          (CSVSniffer *this,DataChunk *data_chunk,CSVStateMachine *state_machine,
          unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
          *info_sql_types_candidates,idx_t start_idx_detection)

{
  string_t *dummy_val;
  LogicalTypeId LVar1;
  ulong uVar2;
  data_ptr_t pdVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  reference vector;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_00;
  reference pvVar8;
  data_ptr_t pdVar9;
  data_ptr_t pdVar10;
  data_ptr_t __s2;
  data_ptr_t pdVar11;
  unsigned_long __n;
  reference pvVar12;
  CSVBufferManager *pCVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  ulong uVar17;
  data_ptr_t pdVar18;
  string_t value;
  char in_stack_fffffffffffffe58;
  LogicalType local_180;
  ulong local_168;
  CSVStateMachine *local_160;
  ulong local_158;
  ulong local_150;
  string separator;
  size_type local_128;
  value_type cur_top_candidate;
  LogicalType local_c8;
  LogicalType local_b0;
  ValidityMask null_mask;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  uVar2 = data_chunk->count;
  bVar15 = false;
  bVar16 = false;
  local_128 = 0;
  local_168 = start_idx_detection;
  local_160 = state_machine;
  do {
    if ((ulong)(((long)(data_chunk->data).
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(data_chunk->data).
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68) <= local_128) {
      return;
    }
    vector = vector<duckdb::Vector,_true>::get<true>(&data_chunk->data,local_128);
    pdVar3 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    TemplatedValidityMask<unsigned_long>::TemplatedValidityMask
              (&null_mask.super_TemplatedValidityMask<unsigned_long>,
               &(vector->validity).super_TemplatedValidityMask<unsigned_long>);
    this_00 = &::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)info_sql_types_candidates,&local_128)->
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
    for (uVar14 = local_168; uVar14 < uVar2; uVar14 = uVar14 + 1) {
      pvVar8 = vector<duckdb::LogicalType,_true>::back((vector<duckdb::LogicalType,_true> *)this_00)
      ;
      LogicalType::LogicalType(&cur_top_candidate,pvVar8);
      local_150 = uVar14 >> 6;
      local_158 = 1L << ((byte)uVar14 & 0x3f);
      dummy_val = (string_t *)(pdVar3 + uVar14 * 0x10);
LAB_0097f93d:
      if ((ulong)(((long)(this_00->
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_00->
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x18) < 2) goto LAB_0097fda7;
      pvVar8 = vector<duckdb::LogicalType,_true>::back((vector<duckdb::LogicalType,_true> *)this_00)
      ;
      separator._M_dataplus._M_p = (pointer)&separator.field_2;
      separator._M_string_length = 0;
      separator.field_2._M_local_buf[0] = '\0';
      if ((null_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((null_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[local_150] & local_158
          ) != 0)) {
        uVar17 = (ulong)(dummy_val->value).pointer.length;
        pdVar9 = pdVar3 + uVar14 * 0x10 + 4;
        if (0xc < uVar17) {
          pdVar9 = (data_ptr_t)(dummy_val->value).pointer.ptr;
        }
        pdVar18 = pdVar9 + uVar17;
        pdVar9 = (data_ptr_t)
                 ::std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(char)>>
                           (pdVar9,pdVar18,StringUtil::CharacterIsSpace);
        if (((((pdVar9 != pdVar18) && ((byte)(*pdVar9 - 0x30) < 10)) &&
             (pdVar9 = (data_ptr_t)
                       ::std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(char)>>
                                 (pdVar9,pdVar18,StringUtil::CharacterIsDigit), pdVar9 != pdVar18))
            && ((pdVar10 = (data_ptr_t)
                           ::std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<bool(*)(char)>>
                                     (pdVar9,pdVar18,StringUtil::CharacterIsDigit),
                pdVar10 != pdVar18 &&
                (__s2 = (data_ptr_t)
                        ::std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(char)>>
                                  (pdVar10,pdVar18,StringUtil::CharacterIsDigit), __s2 != pdVar18)))
            ) && ((pdVar11 = (data_ptr_t)
                             ::std::
                             __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<bool(*)(char)>>
                                       (__s2,pdVar18,StringUtil::CharacterIsDigit),
                  pdVar11 != pdVar18 && ((long)pdVar11 - (long)__s2 == (long)pdVar10 - (long)pdVar9)
                  ))) {
          __n = NumericCastImpl<unsigned_long,_long,_false>::Convert((long)pdVar11 - (long)__s2);
          iVar7 = strncmp((char *)pdVar9,(char *)__s2,__n);
          if (iVar7 == 0) {
            separator._M_string_length = 0;
            *separator._M_dataplus._M_p = '\0';
            for (; pdVar9 < pdVar10; pdVar9 = pdVar9 + 1) {
              if (*pdVar9 == '%') {
                ::std::__cxx11::string::push_back((char)&separator);
              }
              ::std::__cxx11::string::push_back((char)&separator);
            }
            pvVar12 = vector<duckdb::LogicalType,_true>::back
                                ((vector<duckdb::LogicalType,_true> *)this_00);
            if ((pvVar12->id_ == TIMESTAMP && !bVar15) ||
               (pvVar12 = vector<duckdb::LogicalType,_true>::back
                                    ((vector<duckdb::LogicalType,_true> *)this_00),
               pvVar12->id_ == DATE && !bVar16)) {
              DetectDateAndTimeStampFormats(this,local_160,pvVar8,&separator,dummy_val);
            }
          }
        }
      }
      LogicalType::LogicalType(&local_180,VARCHAR);
      bVar4 = LogicalType::operator==(pvVar8,&local_180);
      LogicalType::~LogicalType(&local_180);
      if (bVar4) {
LAB_0097fd28:
        ::std::__cxx11::string::~string((string *)&separator);
        goto LAB_0097f93d;
      }
      pCVar13 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&this->buffer_manager);
      if (null_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask == (unsigned_long *)0x0
         ) {
        bVar4 = false;
      }
      else {
        bVar4 = (null_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[local_150] &
                local_158) == 0;
      }
      value.value.pointer.ptr = (char *)pvVar8;
      value.value._0_8_ = (dummy_val->value).pointer.ptr;
      bVar4 = CanYouCastIt((CSVSniffer *)pCVar13->context,*(ClientContext **)&dummy_val->value,value
                           ,(LogicalType *)&state_machine->dialect_options,
                           (DialectOptions *)(ulong)bVar4,
                           (bool)*(local_160->options->decimal_separator)._M_dataplus._M_p,
                           local_160->options->thousands_separator,in_stack_fffffffffffffe58);
      if (bVar4) goto LAB_0097fd9d;
      if (uVar14 == local_168) {
LAB_0097fd20:
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::pop_back(this_00);
        goto LAB_0097fd28;
      }
      LogicalType::LogicalType(&local_180,BOOLEAN);
      bVar4 = LogicalType::operator==(&cur_top_candidate,&local_180);
      if (!bVar4) {
        LogicalType::LogicalType(&local_c8,DATE);
        bVar4 = LogicalType::operator==(&cur_top_candidate,&local_c8);
        if (!bVar4) {
          LogicalType::LogicalType(&local_b0,TIME);
          bVar4 = LogicalType::operator==(&cur_top_candidate,&local_b0);
          if (!bVar4) {
            LogicalType::LogicalType(&local_60,TIMESTAMP);
            bVar4 = LogicalType::operator==(&cur_top_candidate,&local_60);
            if (bVar4) {
              pvVar8 = vector<duckdb::LogicalType,_true>::get<true>
                                 ((vector<duckdb::LogicalType,_true> *)this_00,
                                  ((long)(this_00->
                                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->
                                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                        )._M_impl.super__Vector_impl_data._M_start) / 0x18 - 2);
              LogicalType::LogicalType(&local_78,TIMESTAMP_TZ);
              bVar5 = LogicalType::operator!=(pvVar8,&local_78);
              bVar6 = true;
              if (!bVar5) goto LAB_0097fcac;
LAB_0097fcde:
              LogicalType::~LogicalType(&local_78);
            }
            else {
LAB_0097fcac:
              LogicalType::LogicalType(&local_48,TIMESTAMP_TZ);
              bVar6 = LogicalType::operator==(&cur_top_candidate,&local_48);
              LogicalType::~LogicalType(&local_48);
              if (bVar4) goto LAB_0097fcde;
            }
            LogicalType::~LogicalType(&local_60);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::~LogicalType(&local_c8);
            LogicalType::~LogicalType(&local_180);
            if (bVar6 == false) goto LAB_0097fd20;
            goto LAB_0097fd69;
          }
          LogicalType::~LogicalType(&local_b0);
        }
        LogicalType::~LogicalType(&local_c8);
      }
      LogicalType::~LogicalType(&local_180);
LAB_0097fd69:
      while( true ) {
        pvVar8 = vector<duckdb::LogicalType,_true>::back
                           ((vector<duckdb::LogicalType,_true> *)this_00);
        LogicalType::LogicalType(&local_180,VARCHAR);
        bVar4 = LogicalType::operator!=(pvVar8,&local_180);
        LogicalType::~LogicalType(&local_180);
        if (!bVar4) break;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::pop_back(this_00);
      }
LAB_0097fd9d:
      ::std::__cxx11::string::~string((string *)&separator);
LAB_0097fda7:
      LogicalType::~LogicalType(&cur_top_candidate);
    }
    pvVar8 = vector<duckdb::LogicalType,_true>::back((vector<duckdb::LogicalType,_true> *)this_00);
    LVar1 = pvVar8->id_;
    pvVar8 = vector<duckdb::LogicalType,_true>::back((vector<duckdb::LogicalType,_true> *)this_00);
    bVar16 = (bool)(bVar16 | LVar1 == DATE);
    bVar15 = (bool)(bVar15 | pvVar8->id_ == TIMESTAMP);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&null_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    local_128 = local_128 + 1;
  } while( true );
}

Assistant:

void CSVSniffer::SniffTypes(DataChunk &data_chunk, CSVStateMachine &state_machine,
                            unordered_map<idx_t, vector<LogicalType>> &info_sql_types_candidates,
                            idx_t start_idx_detection) {
	const idx_t chunk_size = data_chunk.size();
	HasType has_type;
	for (idx_t col_idx = 0; col_idx < data_chunk.ColumnCount(); col_idx++) {
		auto &cur_vector = data_chunk.data[col_idx];
		D_ASSERT(cur_vector.GetVectorType() == VectorType::FLAT_VECTOR);
		D_ASSERT(cur_vector.GetType() == LogicalType::VARCHAR);
		auto vector_data = FlatVector::GetData<string_t>(cur_vector);
		auto null_mask = FlatVector::Validity(cur_vector);
		auto &col_type_candidates = info_sql_types_candidates[col_idx];
		for (idx_t row_idx = start_idx_detection; row_idx < chunk_size; row_idx++) {
			// col_type_candidates can't be empty since anything in a CSV file should at least be a string
			// and we validate utf-8 compatibility when creating the type
			D_ASSERT(!col_type_candidates.empty());
			auto cur_top_candidate = col_type_candidates.back();
			// try cast from string to sql_type
			while (col_type_candidates.size() > 1) {
				const auto &sql_type = col_type_candidates.back();
				// try formatting for date types if the user did not specify one, and it starts with numeric
				// values.
				string separator;
				// If Value is not Null, Has a numeric date format, and the current investigated candidate is
				// either a timestamp or a date
				if (null_mask.RowIsValid(row_idx) && StartsWithNumericDate(separator, vector_data[row_idx]) &&
				    ((col_type_candidates.back().id() == LogicalTypeId::TIMESTAMP && !has_type.timestamp) ||
				     (col_type_candidates.back().id() == LogicalTypeId::DATE && !has_type.date))) {
					DetectDateAndTimeStampFormats(state_machine, sql_type, separator, vector_data[row_idx]);
				}
				// try cast from string to sql_type
				if (sql_type == LogicalType::VARCHAR) {
					// Nothing to convert it to
					continue;
				}
				if (CanYouCastIt(buffer_manager->context, vector_data[row_idx], sql_type, state_machine.dialect_options,
				                 !null_mask.RowIsValid(row_idx), state_machine.options.decimal_separator[0],
				                 state_machine.options.thousands_separator)) {
					break;
				}
				D_ASSERT(cur_top_candidate.id() == LogicalTypeId::VARCHAR || col_type_candidates.size() > 1);
				if (row_idx != start_idx_detection &&
				    (cur_top_candidate == LogicalType::BOOLEAN || cur_top_candidate == LogicalType::DATE ||
				     cur_top_candidate == LogicalType::TIME ||
				     (cur_top_candidate == LogicalType::TIMESTAMP &&
				      col_type_candidates[col_type_candidates.size() - 2] != LogicalType::TIMESTAMP_TZ) ||
				     cur_top_candidate == LogicalType::TIMESTAMP_TZ)) {
					// If we thought this was a boolean value (i.e., T,F, True, False) and it is not, we
					// immediately pop to varchar.
					while (col_type_candidates.back() != LogicalType::VARCHAR) {
						col_type_candidates.pop_back();
					}
					break;
				}
				col_type_candidates.pop_back();
			}
		}
		if (col_type_candidates.back().id() == LogicalTypeId::DATE) {
			has_type.date = true;
		}
		if (col_type_candidates.back().id() == LogicalTypeId::TIMESTAMP) {
			has_type.timestamp = true;
		}
	}
}